

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

second_type
google::protobuf::
FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
          (unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           *collection,first_type *key)

{
  __buckets_ptr pp_Var1;
  int in_ECX;
  _Hash_node_base *in_RDX;
  ulong uVar2;
  second_type pEVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  
  p_Var5 = (_Hash_node_base *)((long)in_ECX * 0x1000193 ^ (long)in_RDX * 0x100011b);
  pEVar3 = (second_type)0x0;
  uVar2 = (ulong)p_Var5 % (ulong)key;
  pp_Var1 = (&(collection->_M_h)._M_buckets)[uVar2];
  if (pp_Var1 != (__buckets_ptr)0x0) {
    p_Var4 = *pp_Var1;
    p_Var6 = p_Var4[4]._M_nxt;
    while (((p_Var6 != p_Var5 || (p_Var4[1]._M_nxt != in_RDX)) ||
           (*(int *)&p_Var4[2]._M_nxt != in_ECX))) {
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) {
        return (second_type)0x0;
      }
      p_Var6 = p_Var4[4]._M_nxt;
      if ((ulong)p_Var6 % (ulong)key != uVar2) {
        return (second_type)0x0;
      }
    }
    pEVar3 = (second_type)p_Var4[3]._M_nxt;
  }
  return pEVar3;
}

Assistant:

typename Collection::value_type::second_type
FindPtrOrNull(Collection& collection,  // NOLINT
              const typename Collection::value_type::first_type& key) {
  typename Collection::iterator it = collection.find(key);
  if (it == collection.end()) {
    return typename Collection::value_type::second_type();
  }
  return it->second;
}